

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFastFieldEntries
          (ParseFunctionGenerator *this,Formatter *format,string *fallback)

{
  TailCallTableInfo *pTVar1;
  pointer pFVar2;
  uint64_t uVar3;
  LogMessage *other;
  string *args;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  pointer pFVar4;
  uchar local_93;
  unsigned_short local_92;
  string *local_90;
  string local_88;
  LogMessage local_68;
  
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
           _M_head_impl;
  pFVar4 = *(pointer *)
            &(pTVar1->fast_path_fields).
             super__Vector_base<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
  ;
  pFVar2 = *(pointer *)
            ((long)&(pTVar1->fast_path_fields).
                    super__Vector_base<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
            + 8);
  if (pFVar4 != pFVar2) {
    local_90 = fallback;
    do {
      if (pFVar4->field != (FieldDescriptor *)0x0) {
        PrintFieldComment<google::protobuf::FieldDescriptor>(format,pFVar4->field);
      }
      args = &pFVar4->func_name;
      if ((pFVar4->func_name)._M_string_length == 0) {
        args = local_90;
      }
      Formatter::operator()(format,"{$1$, ",args);
      if ((pFVar4->bits).data == 0) {
        Formatter::operator()<>(format,"{}");
      }
      else {
        field = extraout_RDX;
        if (pFVar4->field == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                     ,0x262);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (nullptr) != (info.field): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
          internal::LogMessage::~LogMessage(&local_68);
          field = extraout_RDX_00;
        }
        uVar3 = (pFVar4->bits).data;
        local_92 = (unsigned_short)uVar3;
        local_93 = (uchar)(uVar3 >> 0x10);
        FieldName_abi_cxx11_(&local_88,(cpp *)pFVar4->field,field);
        Formatter::operator()
                  (format,
                   "{$1$, $2$, static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
                   &local_92,&local_93,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      Formatter::operator()<>(format,"},\n");
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar2);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFastFieldEntries(
    Formatter& format, const std::string& fallback) {
  for (const auto& info : tc_table_info_->fast_path_fields) {
    if (info.field != nullptr) {
      PrintFieldComment(format, info.field);
    }
    format("{$1$, ", info.func_name.empty() ? fallback : info.func_name);
    if (info.bits.data) {
      GOOGLE_DCHECK_NE(nullptr, info.field);
      format(
          "{$1$, $2$, "
          "static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
          info.bits.coded_tag(), info.bits.hasbit_idx(), FieldName(info.field));
    } else {
      format("{}");
    }
    format("},\n");
  }
}